

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

char __thiscall data_structures::Stack<char>::top(Stack<char> *this)

{
  bool bVar1;
  out_of_range *this_00;
  ListNode<char> *pLVar2;
  Stack<char> *this_local;
  
  bVar1 = isEmpty(this);
  if (!bVar1) {
    pLVar2 = LinkedList<char>::begin(&this->_list);
    return pLVar2->element;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Noting in this stack !");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline
    T Stack<T>::top() {
        if (isEmpty()) {
            throw std::out_of_range("Noting in this stack !");
        }
        return _list.begin()->element;
    }